

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O3

vf_base_t vf_deflate_without_over_or_underflow
                    (vf_base_t input,vf_profile_t profile_in,vf_profile_t profile_out,
                    vf_status_t *status)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  
  if (profile_in.bits <= profile_out.bits) {
    __assert_fail("profile_in.bits > profile_out.bits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0xac,
                  "vf_base_t vf_deflate_without_over_or_underflow(vf_base_t, vf_profile_t, vf_profile_t, vf_status_t *)"
                 );
  }
  if (profile_out.exp_bits <= profile_in.exp_bits) {
    if (profile_out.mnt_bits <= profile_in.mnt_bits) {
      bVar2 = (char)profile_in.mnt_bits - (char)profile_out.mnt_bits;
      if (status != (vf_status_t *)0x0) {
        *status = 0;
      }
      uVar3 = profile_in.sgn_mask >>
              ((char)profile_in.exp_bits + (char)profile_out.mnt_bits + 1U & 0x3f);
      uVar1 = 0;
      if ((~(-1L << (bVar2 + 1 & 0x3f)) & profile_in.mnt_mask & input) != uVar3) {
        uVar1 = uVar3;
      }
      uVar1 = (uVar1 + (profile_in.mnt_mask & input) >> (bVar2 & 0x3f)) +
              ((profile_in.exp_mask & input) +
               ((-1L << ((char)profile_in.exp_bits - (char)profile_out.exp_bits & 0x3fU)) + 1 <<
               (((char)profile_out.exp_bits + (char)profile_in.mnt_bits) - 1U & 0x3f)) >>
               (bVar2 & 0x3f) & profile_out.exp_mask);
      if ((status != (vf_status_t *)0x0) && ((uVar1 & profile_out.mask) == profile_out.exp_mask)) {
        *status = -3;
      }
      return uVar1 + ((profile_in.sgn_mask & input) >>
                     ((char)profile_in.bits - (char)profile_out.bits & 0x3fU)) & profile_out.mask;
    }
    __assert_fail("profile_in.mnt_bits >= profile_out.mnt_bits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0xae,
                  "vf_base_t vf_deflate_without_over_or_underflow(vf_base_t, vf_profile_t, vf_profile_t, vf_status_t *)"
                 );
  }
  __assert_fail("profile_in.exp_bits >= profile_out.exp_bits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                ,0xad,
                "vf_base_t vf_deflate_without_over_or_underflow(vf_base_t, vf_profile_t, vf_profile_t, vf_status_t *)"
               );
}

Assistant:

vf_base_t vf_deflate_without_over_or_underflow(vf_base_t input, vf_profile_t profile_in, vf_profile_t profile_out, vf_status_t *status) {
	// casting between different profiles of same bit length not supported yet. Patches welcome.
	assert(profile_in.bits > profile_out.bits);
	assert(profile_in.exp_bits >= profile_out.exp_bits);
	assert(profile_in.mnt_bits >= profile_out.mnt_bits);
	
	vf_base_t exp_in;
	vf_base_t mnt_in;
	
	vf_base_t sgn_out;
	vf_base_t exp_out;
	vf_base_t mnt_out;
	
	const vf_base_t mnt_shift = profile_in.mnt_bits - profile_out.mnt_bits;
	const vf_base_t bits_delta = profile_in.bits - profile_out.bits;
	const vf_base_t underflow_threshold = (((vf_base_t)0x1 << (profile_in.exp_bits - profile_out.exp_bits)) - 1) << (profile_in.mnt_bits + profile_out.exp_bits - 1);
	
	vf_set_status(status, VF_STATUS_OK);
	
	sgn_out = (input & profile_in.sgn_mask) >> bits_delta;
	exp_in = input & profile_in.exp_mask;
	
	exp_out = ((exp_in - underflow_threshold) >> mnt_shift) & profile_out.exp_mask;
	mnt_in = input & profile_in.mnt_mask;
	// Handle rounding by adding 1 to the bit beyond half precision
	const vf_base_t round_bit = profile_in.sgn_mask >> (1 + profile_in.exp_bits + profile_out.mnt_bits);
#if VF_ROUND_TIES_TO_EVEN
	/*
	 * If the last bit in the half sgnificand is 0 (already even), and
	 * the remaining bit pattern is 1000...0, then we do not add one
	 * to the bit after the half sgnificand.  In all other cases, we do.
	 */
	const vf_base_t rounding_mask = ((vf_base_t)1 << (profile_in.mnt_bits - profile_out.mnt_bits + 1)) - 1;
	if ((mnt_in & rounding_mask) != round_bit) {
		mnt_in += round_bit;
	}
#else
	mnt_in += round_bit;
#endif
	mnt_out = mnt_in >> mnt_shift;
	/*
	 * If the rounding causes a bit to spill into exp_out, it will
	 * increment exp_out by one and mnt_out will be zero.  This is the
	 * correct result.  exp_out may increment to bias, at greatest, in
	 * which case the result overflows to a sgned inf.
	 */
	if (((mnt_out + exp_out) & profile_out.mask) == profile_out.exp_mask) {
		vf_set_status(status, VF_STATUS_OVERFLOW);
	}
	const vf_base_t output = (sgn_out + exp_out + mnt_out) & profile_out.mask;
	return output;
}